

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O2

void __thiscall
duckdb::KeyValueSecretReader::ThrowNotFoundError(KeyValueSecretReader *this,string *secret_key)

{
  KeyValueSecret *pKVar1;
  InvalidConfigurationException *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string secret_scope;
  string secret_scope_hint_message;
  string base_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::__cxx11::string::string
            ((string *)&base_message,"Failed to fetch required secret key \'%s\' from secret",
             (allocator *)&secret_scope);
  if ((this->secret).ptr == (KeyValueSecret *)0x0) {
    ::std::__cxx11::string::string((string *)&secret_scope,(string *)&this->path);
    if (secret_scope._M_string_length == 0) {
      ::std::__cxx11::string::string
                ((string *)&secret_scope_hint_message,".",(allocator *)&local_120);
    }
    else {
      ::std::operator+(&local_120," for \'",&secret_scope);
      ::std::operator+(&secret_scope_hint_message,&local_120,"\'.");
      ::std::__cxx11::string::~string((string *)&local_120);
    }
    pIVar2 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_120,&base_message,", because no secret was found%s");
    ::std::__cxx11::string::string((string *)&local_40,(string *)secret_key);
    ::std::__cxx11::string::string((string *)&local_60,(string *)&secret_scope_hint_message);
    InvalidConfigurationException::
    InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string>
              (pIVar2,&local_120,&local_40,&local_60);
    __cxa_throw(pIVar2,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error
               );
  }
  pIVar2 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
  ::std::operator+(&secret_scope,&base_message," \'%s\'.");
  ::std::__cxx11::string::string((string *)&local_80,(string *)secret_key);
  pKVar1 = optional_ptr<const_duckdb::KeyValueSecret,_true>::operator->(&this->secret);
  ::std::__cxx11::string::string((string *)&local_a0,(string *)&(pKVar1->super_BaseSecret).name);
  InvalidConfigurationException::
  InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string>
            (pIVar2,&secret_scope,&local_80,&local_a0);
  __cxa_throw(pIVar2,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void KeyValueSecretReader::ThrowNotFoundError(const string &secret_key) {
	string base_message = "Failed to fetch required secret key '%s' from secret";

	if (!secret) {
		string secret_scope = path;
		string secret_scope_hint_message = secret_scope.empty() ? "." : " for '" + secret_scope + "'.";
		throw InvalidConfigurationException(base_message + ", because no secret was found%s", secret_key,
		                                    secret_scope_hint_message);
	}

	throw InvalidConfigurationException(base_message + " '%s'.", secret_key, secret->GetName());
}